

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.cpp
# Opt level: O0

bool __thiscall HTTPServerPlugin::initialize(HTTPServerPlugin *this)

{
  byte bVar1;
  unsigned_short uVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined1 auVar5 [16];
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  HTTPServerPlugin *this_local;
  
  bVar3 = sv("BindAddress",0xb);
  bVar4 = sv("0.0.0.0",7);
  local_30 = bVar3._M_len;
  local_28 = bVar3._M_str;
  local_40 = bVar4._M_len;
  local_38 = bVar4._M_str;
  auVar5 = Jupiter::Config::get(&this->field_0x38,local_30,local_28,local_40,local_38);
  bVar3 = sv("BindPort",8);
  uVar2 = Jupiter::Config::get<unsigned_short>((Config *)&this->field_0x38,bVar3,0x50);
  bVar1 = Jupiter::HTTP::Server::bind(&this->server,auVar5._0_8_,auVar5._8_8_,uVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool HTTPServerPlugin::initialize() {
	return HTTPServerPlugin::server.bind(this->config.get("BindAddress"sv, "0.0.0.0"sv), this->config.get<uint16_t>("BindPort"sv, 80));
}